

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ClearDepthStencilImage
          (VulkanCommandBuffer *this,VkImage Image,VkClearDepthStencilValue *DepthStencil,
          VkImageSubresourceRange *Subresource)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  VkImageSubresourceRange *Subresource_local;
  VkClearDepthStencilValue *DepthStencil_local;
  VkImage Image_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = Subresource;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Subresource);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x4b);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = IsInRenderScope(this);
  if (bVar1) {
    Diligent::FormatString<char[180]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [180])
               "vkCmdClearDepthStencilImage() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x4e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (((*(uint *)msg.field_2._8_8_ & 6) == 0) || ((*(uint *)msg.field_2._8_8_ & 0xfffffff9) != 0)) {
    Diligent::FormatString<char[240]>
              ((string *)local_98,
               (char (*) [240])
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-aspectMask-02824)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x53);
    std::__cxx11::string::~string((string *)local_98);
  }
  FlushBarriers(this);
  (*vkCmdClearDepthStencilImage)
            (this->m_VkCmdBuffer,Image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,DepthStencil,1,
             (VkImageSubresourceRange *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void ClearDepthStencilImage(VkImage                         Image,
                                              const VkClearDepthStencilValue& DepthStencil,
                                              const VkImageSubresourceRange&  Subresource)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdClearDepthStencilImage() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-renderpass)");
        // clang-format off
        VERIFY((Subresource.aspectMask &  (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT)) != 0 &&
               (Subresource.aspectMask & ~(VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT)) == 0,
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT "
                "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-aspectMask-02824)");
        // clang-format on

        FlushBarriers();
        vkCmdClearDepthStencilImage(
            m_VkCmdBuffer,
            Image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, // must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
            &DepthStencil,
            1,
            &Subresource);
    }